

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall ON_SubDVertex::MarkedEdgeCount(ON_SubDVertex *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  unsigned_short vei;
  ulong uVar4;
  
  uVar2 = 0;
  for (uVar4 = 0; uVar4 < this->m_edge_count; uVar4 = uVar4 + 1) {
    uVar3 = this->m_edges[uVar4].m_ptr & 0xfffffffffffffff8;
    if (uVar3 != 0) {
      bVar1 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(uVar3 + 0x10));
      uVar2 = uVar2 + bVar1;
    }
  }
  return uVar2;
}

Assistant:

unsigned int ON_SubDVertex::MarkedEdgeCount() const
{
  unsigned int mark_count = 0;
  for (unsigned short vei = 0; vei < m_edge_count; ++vei)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr != e && e->m_status.RuntimeMark())
      ++mark_count;
  }
  return mark_count;
}